

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O0

bool __thiscall DActiveButton::AdvanceFrame(DActiveButton *this)

{
  int iVar1;
  FSwitchDef *local_30;
  FSwitchDef *def;
  bool ret;
  DActiveButton *this_local;
  
  def._7_1_ = false;
  if ((this->bReturning & 1U) == 0) {
    local_30 = this->m_SwitchDef;
  }
  else {
    local_30 = this->m_SwitchDef->PairDef;
  }
  iVar1 = this->m_Frame + 1;
  this->m_Frame = iVar1;
  if (iVar1 == local_30->NumFrames - 1) {
    def._7_1_ = (this->bFlippable & 1U) != 1;
    if (!def._7_1_) {
      this->m_Timer = 0x23;
    }
  }
  else {
    this->m_Timer = (uint)local_30->frames[this->m_Frame].TimeMin;
    if (local_30->frames[this->m_Frame].TimeRnd != 0) {
      iVar1 = FRandom::operator()(&pr_switchanim,(uint)local_30->frames[this->m_Frame].TimeRnd);
      this->m_Timer = iVar1 + this->m_Timer;
    }
  }
  return def._7_1_;
}

Assistant:

bool DActiveButton::AdvanceFrame ()
{
	bool ret = false;
	FSwitchDef *def = bReturning? m_SwitchDef->PairDef : m_SwitchDef;

	if (++m_Frame == def->NumFrames - 1)
	{
		if (bFlippable == true)
		{
			m_Timer = BUTTONTIME;
		}
		else
		{
			ret = true;
		}
	}
	else
	{
		m_Timer = def->frames[m_Frame].TimeMin;
		if (def->frames[m_Frame].TimeRnd != 0)
		{
			m_Timer += pr_switchanim(def->frames[m_Frame].TimeRnd);
		}
	}
	return ret;
}